

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_strategy.c
# Opt level: O2

int av1_encode_strategy(AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size,uint *frame_flags,
                       int64_t *time_stamp,int64_t *time_end,aom_rational64_t *timestamp_ratio,
                       int *pop_lookahead,int flush)

{
  AV1_COMMON *cm;
  int *piVar1;
  byte bVar2;
  FRAME_UPDATE_TYPE FVar3;
  int iVar4;
  lookahead_ctx *plVar5;
  SequenceHeader *pSVar6;
  aom_metadata_array_t *arr;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  FRAME_TYPE FVar11;
  COMPRESSOR_STAGE stage;
  uint8_t uVar12;
  int i;
  uint uVar13;
  int iVar14;
  int iVar16;
  AV1_PRIMARY *pAVar17;
  lookahead_entry *plVar18;
  MB_MODE_INFO_EXT_FRAME *pMVar19;
  lookahead_entry *plVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  YV12_BUFFER_CONFIG *pYVar24;
  ulong uVar25;
  AV1_PRIMARY *pAVar26;
  byte bVar27;
  long lVar28;
  long lVar29;
  RefCntBuffer *pRVar30;
  aom_enc_pass aVar31;
  MV_STATS *pMVar32;
  ulong uVar33;
  YV12_BUFFER_CONFIG *pYVar34;
  uint uVar35;
  MV_STATS *pMVar36;
  long lVar37;
  aom_enc_pass aVar38;
  size_t *psVar39;
  bool bVar40;
  char cVar41;
  double dVar42;
  double dVar43;
  EncodeFrameInput frame_input;
  EncodeFrameParams local_148;
  uint *local_f8;
  AV1_PRIMARY *local_f0;
  int *local_e8;
  size_t *local_e0;
  size_t frame_size;
  AV1_COMMON *local_d0;
  uint8_t *local_c8;
  size_t local_c0;
  RefFrameMapPair ref_frame_map_pairs [8];
  int local_6c;
  YV12_BUFFER_CONFIG *ref_frame_buf [7];
  int iVar15;
  
  bVar27 = 0;
  pAVar26 = cpi->ppi;
  frame_input.ts_duration = 0;
  frame_input.source = (YV12_BUFFER_CONFIG *)0x0;
  frame_input.last_source = (YV12_BUFFER_CONFIG *)0x0;
  local_148.error_resilient_mode = 0;
  local_148.frame_type = '\0';
  local_148._5_3_ = 0;
  local_148.primary_ref_frame = 0;
  local_148.order_offset = 0;
  local_148.show_frame = 0;
  local_148.refresh_frame_flags = 0;
  local_148.show_existing_frame = 0;
  local_148.existing_fb_idx_to_show = 0;
  local_148.ref_frame_flags = 0;
  local_148.remapped_ref_idx[0] = 0;
  local_148.remapped_ref_idx[1] = 0;
  local_148.remapped_ref_idx[2] = 0;
  frame_size = 0;
  local_148.remapped_ref_idx[3] = 0;
  local_148.remapped_ref_idx[4] = 0;
  local_148.remapped_ref_idx[5] = 0;
  local_148.remapped_ref_idx[6] = 0;
  local_148.remapped_ref_idx[7] = 0;
  local_148.refresh_frame.golden_frame = false;
  local_148.refresh_frame.bwd_ref_frame = false;
  local_148.refresh_frame.alt_ref_frame = false;
  local_148._71_1_ = 0;
  local_148.speed = 0;
  pAVar17 = pAVar26;
  local_c8 = dest;
  local_c0 = dest_size;
  if (flush == 0) {
    uVar13 = av1_lookahead_depth(pAVar26->lookahead,cpi->compressor_stage);
    iVar14 = av1_lookahead_pop_sz(cpi->ppi->lookahead,cpi->compressor_stage);
    if ((int)uVar13 < iVar14) {
      return -1;
    }
    pAVar17 = cpi->ppi;
  }
  plVar18 = av1_lookahead_peek(pAVar17->lookahead,0,cpi->compressor_stage);
  if (plVar18 == (lookahead_entry *)0x0) goto LAB_0034bac3;
  cm = &cpi->common;
  if (((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) {
    iVar14 = (cpi->oxcf).gf_cfg.gf_min_pyr_height;
    iVar15 = (cpi->oxcf).gf_cfg.gf_max_pyr_height;
    iVar16 = 1;
    if (iVar15 < 1) {
      iVar16 = iVar15;
    }
    (cpi->oxcf).gf_cfg.gf_max_pyr_height = iVar16;
    if (iVar14 < iVar16) {
      iVar16 = iVar14;
    }
    (cpi->oxcf).gf_cfg.gf_min_pyr_height = iVar16;
  }
  local_f0 = pAVar26;
  iVar14 = av1_alloc_context_buffers
                     (cm,(cpi->common).width,(cpi->common).height,
                      (cpi->sf).part_sf.default_min_partition_size);
  if (iVar14 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate context buffers")
    ;
  }
  aVar38 = AOM_RC_FIRST_PASS;
  aVar31 = (cpi->oxcf).pass;
  local_d0 = cm;
  if (aVar31 == AOM_RC_FIRST_PASS) {
    local_e8 = &cpi->skip_tpl_setup_stats;
    cpi->skip_tpl_setup_stats = 0;
  }
  else {
    if (cpi->compressor_stage == '\x01') {
LAB_0034b637:
      cpi->skip_tpl_setup_stats = 0;
    }
    else {
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [(cpi->common).mi_params.mi_alloc_bsize];
      iVar14 = (int)((bVar2 - 1) + (cpi->common).mi_params.mi_cols) / (int)(uint)bVar2;
      iVar15 = ((int)((cpi->common).mi_params.mi_rows + (bVar2 - 1)) / (int)(uint)bVar2) * iVar14;
      local_f8 = frame_flags;
      if (iVar15 <= (cpi->mbmi_ext_info).alloc_size) {
        (cpi->mbmi_ext_info).stride = iVar14;
        goto LAB_0034b637;
      }
      aom_free((cpi->mbmi_ext_info).frame_base);
      (cpi->mbmi_ext_info).frame_base = (MB_MODE_INFO_EXT_FRAME *)0x0;
      (cpi->mbmi_ext_info).alloc_size = 0;
      pMVar19 = (MB_MODE_INFO_EXT_FRAME *)aom_malloc((long)iVar15 * 0x54);
      (cpi->mbmi_ext_info).frame_base = pMVar19;
      if (pMVar19 == (MB_MODE_INFO_EXT_FRAME *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate mbmi_ext_info->frame_base");
      }
      (cpi->mbmi_ext_info).alloc_size = iVar15;
      aVar31 = (cpi->oxcf).pass;
      (cpi->mbmi_ext_info).stride = iVar14;
      local_e8 = &cpi->skip_tpl_setup_stats;
      cpi->skip_tpl_setup_stats = 0;
      frame_flags = local_f8;
      if (aVar31 == AOM_RC_FIRST_PASS) goto LAB_0034b688;
    }
    local_e8 = &cpi->skip_tpl_setup_stats;
    aVar38 = aVar31;
    if ((cpi->ppi->tpl_data).tpl_stats_pool[0] == (TplDepStats *)0x0) {
      av1_setup_tpl_buffers
                (cpi->ppi,&(cpi->common).mi_params,(cpi->oxcf).frm_dim_cfg.width,
                 (cpi->oxcf).frm_dim_cfg.height,0,(cpi->oxcf).gf_cfg.lag_in_frames);
      aVar38 = (cpi->oxcf).pass;
    }
  }
LAB_0034b688:
  (cpi->twopass_frame).this_frame = (FIRSTPASS_STATS *)0x0;
  iVar14 = is_one_pass_rt_params(cpi);
  local_e0 = size;
  if (iVar14 == 0) {
    if ((aVar38 != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
      pAVar26 = cpi->ppi;
      if (0 < (pAVar26->gf_group).frame_parallel_level[cpi->gf_frame_index]) {
        for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
          (cpi->rc).frame_level_rate_correction_factors[lVar28] =
               (pAVar26->p_rc).rate_correction_factors[lVar28];
        }
      }
      pMVar32 = &pAVar26->mv_stats;
      pMVar36 = &cpi->mv_stats;
      for (lVar28 = 0x4c; lVar28 != 0; lVar28 = lVar28 + -1) {
        *(char *)&pMVar36->high_prec = (char)pMVar32->high_prec;
        pMVar32 = (MV_STATS *)((long)pMVar32 + (ulong)bVar27 * -2 + 1);
        pMVar36 = (MV_STATS *)((long)pMVar36 + (ulong)bVar27 * -2 + 1);
      }
      av1_get_second_pass_params(cpi,&local_148,*frame_flags);
      aVar38 = (cpi->oxcf).pass;
      goto LAB_0034b6aa;
    }
LAB_0034b794:
    local_148._24_8_ = local_148._24_8_ & 0xffffffff00000000;
LAB_0034b799:
    pAVar26 = cpi->ppi;
    bVar27 = (pAVar26->gf_group).arf_src_offset[cpi->gf_frame_index];
    uVar13 = (uint)bVar27;
    if (bVar27 != 0) {
      iVar16 = is_forced_keyframe_pending(pAVar26->lookahead,(uint)bVar27,cpi->compressor_stage);
      iVar15 = flush;
      if ((((iVar16 != -1) && ((cpi->oxcf).rc_cfg.mode != AOM_Q)) &&
          ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) && (cpi->compressor_stage != '\x01')) {
        flush = 1;
        goto LAB_0034b91b;
      }
      goto LAB_0034b7ef;
    }
LAB_0034b91b:
    *pop_lookahead = 1;
    uVar35 = 0;
    iVar16 = 1;
    uVar13 = 0;
    if (((cpi->oxcf).kf_cfg.enable_keyframe_filtering < 2) ||
       (uVar13 = uVar35, (pAVar26->gf_group).update_type[cpi->gf_frame_index] != '\x03')) {
LAB_0034b99f:
      if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01'))
      goto LAB_0034b9b1;
    }
    else {
      if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (bVar27 = cpi->compressor_stage, bVar27 != 1))
      {
        plVar5 = cpi->ppi->lookahead;
        if (plVar5 != (lookahead_ctx *)0x0) {
          iVar4 = plVar5->read_ctxs[bVar27].sz;
          if (iVar4 != 0) {
            uVar13 = 0;
            iVar15 = flush;
            if (flush == 0) {
              flush = 0;
              uVar13 = 0;
              iVar15 = 0;
              if (iVar4 != plVar5->read_ctxs[bVar27].pop_sz) goto LAB_0034b99f;
            }
LAB_0034b7ef:
            flush = iVar15;
            *pop_lookahead = 0;
            iVar16 = 0;
          }
        }
        goto LAB_0034b99f;
      }
LAB_0034b9b1:
      *pop_lookahead = 1;
      uVar13 = 0;
      iVar16 = 1;
    }
    local_148.show_frame = iVar16;
    uVar35 = (pAVar26->gf_group).src_offset[cpi->gf_frame_index];
    if (((uVar35 != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) {
      uVar13 = uVar35;
    }
    if (iVar16 != 0) {
      pAVar26 = cpi->ppi;
      stage = cpi->compressor_stage;
      if ((cpi->common).current_frame.frame_number == 0) {
        plVar18 = (lookahead_entry *)0x0;
      }
      else {
        plVar18 = av1_lookahead_peek(pAVar26->lookahead,uVar13 - 1,stage);
        pAVar26 = cpi->ppi;
        stage = cpi->compressor_stage;
      }
      plVar20 = av1_lookahead_peek(pAVar26->lookahead,uVar13,stage);
      goto LAB_0034ba70;
    }
    plVar20 = av1_lookahead_peek(cpi->ppi->lookahead,uVar13,cpi->compressor_stage);
    if (plVar20 == (lookahead_entry *)0x0) goto LAB_0034bac3;
    (cpi->common).showable_frame = 1;
    plVar18 = (lookahead_entry *)0x0;
  }
  else {
LAB_0034b6aa:
    pAVar26 = local_f0;
    if ((aVar38 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) goto LAB_0034b794;
    FVar3 = (local_f0->gf_group).update_type[cpi->gf_frame_index];
    if ((FVar3 != '\x04') ||
       ((uVar13 = 1, (local_f0->gf_group).refbuf_state[cpi->gf_frame_index] != '\0' &&
        (cpi->ppi->show_existing_alt_ref == 0)))) {
      uVar13 = (uint)(FVar3 == '\x05');
    }
    local_148.show_existing_frame = uVar13;
    if ((cpi->common).current_frame.frame_number == 0) {
      uVar13 = 0;
    }
    else {
      uVar35 = *frame_flags;
      plVar18 = av1_lookahead_peek(cpi->ppi->lookahead,0,cpi->compressor_stage);
      uVar13 = 1;
      if (plVar18 != (lookahead_entry *)0x0) {
        bVar27 = 1;
        if ((cpi->oxcf).tool_cfg.error_resilient_mode == false) {
          bVar27 = (*(byte *)((long)&plVar18->flags + 3) & 0x10) >> 4;
        }
        if (((cpi->oxcf).kf_cfg.enable_sframe != false) ||
           ((bVar27 | (byte)((ulong)plVar18->flags >> 0x1d) & 1) == 1)) {
          uVar13 = (byte)((byte)uVar35 | (cpi->rc).frames_to_key == 0) & 1;
        }
      }
    }
    uVar13 = uVar13 & local_148.show_existing_frame;
    local_148.show_existing_frame = uVar13;
    uVar22 = (ulong)cpi->gf_frame_index;
    if (((cpi->oxcf).rc_cfg.drop_frames_water_mark != 0) &&
       (((pAVar26->gf_group).update_type[uVar22] & 0xfe) == 4)) {
      uVar25 = 0;
      do {
        uVar33 = uVar25;
        if (uVar22 == uVar33) goto LAB_0034b8c6;
        uVar25 = uVar33 + 1;
      } while ((pAVar26->gf_group).display_idx[uVar22] != (pAVar26->gf_group).display_idx[uVar33]);
      if ((pAVar26->gf_group).is_frame_dropped[uVar33] == true) {
        local_148._24_8_ = (ulong)(uint)local_148.existing_fb_idx_to_show << 0x20;
        cpi->is_dropped_frame = true;
        uVar13 = 0;
      }
    }
LAB_0034b8c6:
    if ((pAVar26->gf_group).update_type[uVar22] == '\x04') {
      cpi->ppi->show_existing_alt_ref = 0;
    }
    if (uVar13 == 0) goto LAB_0034b799;
    plVar18 = (lookahead_entry *)0x0;
    plVar20 = av1_lookahead_peek(cpi->ppi->lookahead,0,cpi->compressor_stage);
    *pop_lookahead = 1;
    local_148.show_frame = 1;
LAB_0034ba70:
    if (plVar20 == (lookahead_entry *)0x0) {
LAB_0034bac3:
      if (flush == 0) {
        return -1;
      }
      if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
        if ((cpi->ppi->twopass).first_pass_done == 0) {
          av1_end_first_pass(cpi);
          (cpi->ppi->twopass).first_pass_done = 1;
          return -1;
        }
        return -1;
      }
      return -1;
    }
  }
  (local_f0->gf_group).src_offset[cpi->gf_frame_index] = 0;
  frame_input.source = &plVar20->img;
  if (((cpi->ppi->use_svc != 0) || ((cpi->rc).prev_frame_is_dropped != 0)) &&
     (plVar18 != (lookahead_entry *)0x0)) {
    av1_svc_set_last_source(cpi,&frame_input,&plVar18->img);
    plVar18 = (lookahead_entry *)frame_input.last_source;
  }
  frame_input.last_source = &plVar18->img;
  pAVar26 = local_f0;
  lVar28 = plVar20->ts_start;
  frame_input.ts_duration = plVar20->ts_end - lVar28;
  cpi->unfiltered_source = frame_input.source;
  *time_stamp = lVar28;
  *time_end = plVar20->ts_end;
  lVar28 = plVar20->ts_start;
  if (lVar28 < (cpi->time_stamps).first_ts_start) {
    (cpi->time_stamps).first_ts_start = lVar28;
    (cpi->time_stamps).prev_ts_end = lVar28;
  }
  av1_apply_encoding_flags(cpi,plVar20->flags);
  *frame_flags = (uint)plVar20->flags & 1;
  if (local_148.show_frame != 0) {
    lVar28 = plVar20->ts_start;
    lVar29 = plVar20->ts_end;
    pAVar17 = cpi->ppi;
    if (((pAVar17->use_svc == 0) || ((pAVar17->rtc_ref).set_ref_frame_config == 0)) ||
       (((cpi->svc).number_spatial_layers < 2 ||
        (lVar21 = lVar29 - lVar28, lVar21 == 0 || lVar29 < lVar28)))) {
      lVar23 = (cpi->time_stamps).first_ts_start;
      if (lVar23 == lVar28) {
        lVar21 = lVar29 - lVar28;
        if (lVar21 == 0) goto LAB_0034bc49;
        goto LAB_0034bc2d;
      }
      lVar37 = (cpi->time_stamps).prev_ts_end;
      lVar21 = lVar29 - lVar37;
      lVar37 = lVar37 - (cpi->time_stamps).prev_ts_start;
      if (lVar37 != 0) {
        if (lVar21 == 0) goto LAB_0034bc49;
        if ((int)(((lVar21 - lVar37) * 10) / lVar37) != 0) goto LAB_0034bc2d;
LAB_0034be00:
        lVar23 = lVar29 - lVar23;
        if (9999999 < lVar23) {
          lVar23 = 10000000;
        }
        dVar43 = 10000000.0 / cpi->framerate;
        dVar42 = 10000000.0 /
                 ((((double)lVar21 + ((double)lVar23 - dVar43)) * dVar43) / (double)lVar23);
        cpi->new_framerate = dVar42;
        dVar43 = cpi->framerate;
        if ((pAVar17->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1) {
          dVar43 = dVar42;
        }
        goto LAB_0034bc41;
      }
      if (lVar21 != 0) goto LAB_0034be00;
    }
    else {
LAB_0034bc2d:
      cpi->new_framerate = 10000000.0 / (double)lVar21;
      dVar43 = 10000000.0 / (double)lVar21;
LAB_0034bc41:
      av1_new_framerate(cpi,dVar43);
    }
LAB_0034bc49:
    (cpi->time_stamps).prev_ts_start = lVar28;
    (cpi->time_stamps).prev_ts_end = lVar29;
  }
  if (local_148.show_existing_frame == 0) {
    if (cpi->film_grain_table == (aom_film_grain_table_t *)0x0) {
      uVar12 = ((cpi->common).seq_params)->film_grain_params_present;
    }
    else {
      iVar15 = aom_film_grain_table_lookup
                         (cpi->film_grain_table,*time_stamp,*time_end,0,
                          &(cpi->common).film_grain_params);
      uVar12 = (uint8_t)iVar15;
    }
    ((cpi->common).cur_frame)->film_grain_params_present = uVar12;
    lVar28 = timestamp_ratio->num;
    uVar22 = (long)((lVar28 / 2 - (ulong)(1 < lVar28)) + (long)timestamp_ratio->den * *time_stamp) /
             lVar28;
    if (uVar22 >> 0x20 != 0) {
      return 1;
    }
    (cpi->common).frame_presentation_time = (uint32_t)uVar22;
  }
  if (iVar14 != 0) {
    av1_get_one_pass_rt_params(cpi,&local_148.frame_type,&frame_input,*frame_flags);
    iVar15 = use_rtc_reference_structure_one_layer(cpi);
    if (iVar15 != 0) {
      av1_set_rtc_reference_structure_one_layer(cpi,(uint)(cpi->gf_frame_index == '\0'));
    }
  }
  FVar3 = (pAVar26->gf_group).update_type[cpi->gf_frame_index];
  if ((local_148.show_existing_frame != 0) && (local_148.frame_type != '\0')) {
    local_148.frame_type = '\x01';
  }
  local_148.speed = (cpi->oxcf).speed;
  aVar31 = (cpi->oxcf).pass;
  if (iVar14 == 0) {
    if ((aVar31 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
LAB_0034bd79:
      bVar27 = 1;
      if (((cpi->common).current_frame.frame_number != 0) && ((cpi->oxcf).kf_cfg.key_freq_max != 0))
      {
        bVar27 = (byte)*frame_flags & 1;
      }
      bVar27 = (byte)(FVar3 - 6) < 0xfe & bVar27;
      if (aVar31 == AOM_RC_FIRST_PASS || bVar27 != 0) {
        bVar27 = bVar27 ^ 1;
      }
      else {
        bVar27 = 1;
        if (cpi->compressor_stage != '\x01') goto LAB_0034bdbf;
      }
      local_148.frame_type = bVar27;
      goto LAB_0034bdbf;
    }
    if (aVar31 != AOM_RC_FIRST_PASS) {
      if (aVar31 == AOM_RC_ONE_PASS) {
        if (cpi->ppi->lap_enabled == 0) goto LAB_0034bd79;
        goto LAB_0034bdd0;
      }
      goto LAB_0034be90;
    }
LAB_0034be99:
    uVar13 = 0;
    if ((cpi->oxcf).rc_cfg.best_allowed_q == 0) {
      uVar13 = (uint)((cpi->oxcf).rc_cfg.worst_allowed_q == 0);
    }
    (cpi->td).mb.e_mbd.lossless[0] = uVar13;
LAB_0034beb6:
    if ((aVar31 != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) goto LAB_0034bec4;
  }
  else {
LAB_0034bdbf:
    if (aVar31 == AOM_RC_FIRST_PASS) goto LAB_0034be99;
    if (aVar31 == AOM_RC_ONE_PASS) {
LAB_0034bdd0:
      if ((cpi->ppi->lap_enabled != 0) || ((cpi->oxcf).q_cfg.aq_mode != '\x03')) goto LAB_0034be90;
      av1_cyclic_refresh_update_parameters(cpi);
      aVar31 = (cpi->oxcf).pass;
      goto LAB_0034beb6;
    }
LAB_0034be90:
    if (cpi->compressor_stage == '\x01') goto LAB_0034be99;
LAB_0034bec4:
    if ((cpi->ext_flags).use_s_frame == true) {
      local_148._0_5_ = 0x300000000;
    }
    if ((cpi->ext_flags).refresh_frame_context_pending == true) {
      (cpi->common).features.refresh_frame_context = (cpi->ext_flags).refresh_frame_context;
      (cpi->ext_flags).refresh_frame_context_pending = false;
    }
    (cpi->common).features.allow_ref_frame_mvs = (cpi->ext_flags).use_ref_frame_mvs;
    bVar27 = (cpi->ext_flags).use_error_resilient;
    if (local_148.frame_type == '\0') {
      bVar27 = 0;
    }
    local_148.error_resilient_mode = (uint)(local_148.frame_type == '\x03' | bVar27);
  }
  av1_configure_buffer_updates
            (cpi,&local_148.refresh_frame,FVar3,
             (pAVar26->gf_group).refbuf_state[cpi->gf_frame_index],
             (uint)(local_148.show_existing_frame == 0 &&
                   (local_148.frame_type == '\x03' ||
                   local_148.show_frame != 0 && local_148.frame_type == '\0')));
  if (((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) {
    pAVar17 = cpi->ppi;
    bVar27 = cpi->gf_frame_index;
    if ((pAVar17->gf_group).update_type[bVar27] == '\0') {
      ref_frame_map_pairs[6].pyr_level = -1;
      ref_frame_map_pairs[6].disp_order = -1;
      ref_frame_map_pairs[7].pyr_level = -1;
      ref_frame_map_pairs[7].disp_order = -1;
      ref_frame_map_pairs[4].pyr_level = -1;
      ref_frame_map_pairs[4].disp_order = -1;
      ref_frame_map_pairs[5].pyr_level = -1;
      ref_frame_map_pairs[5].disp_order = -1;
      ref_frame_map_pairs[2].pyr_level = -1;
      ref_frame_map_pairs[2].disp_order = -1;
      ref_frame_map_pairs[3].pyr_level = -1;
      ref_frame_map_pairs[3].disp_order = -1;
      ref_frame_map_pairs[0].pyr_level = -1;
      ref_frame_map_pairs[0].disp_order = -1;
      ref_frame_map_pairs[1].pyr_level = -1;
      ref_frame_map_pairs[1].disp_order = -1;
    }
    else {
      ref_frame_map_pairs[6].pyr_level = 0;
      ref_frame_map_pairs[6].disp_order = 0;
      ref_frame_map_pairs[7].pyr_level = 0;
      ref_frame_map_pairs[7].disp_order = 0;
      ref_frame_map_pairs[4].pyr_level = 0;
      ref_frame_map_pairs[4].disp_order = 0;
      ref_frame_map_pairs[5].pyr_level = 0;
      ref_frame_map_pairs[5].disp_order = 0;
      ref_frame_map_pairs[2].pyr_level = 0;
      ref_frame_map_pairs[2].disp_order = 0;
      ref_frame_map_pairs[3].pyr_level = 0;
      ref_frame_map_pairs[3].disp_order = 0;
      ref_frame_map_pairs[0].pyr_level = 0;
      ref_frame_map_pairs[0].disp_order = 0;
      ref_frame_map_pairs[1].pyr_level = 0;
      ref_frame_map_pairs[1].disp_order = 0;
      for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
        if (ref_frame_map_pairs[lVar28].disp_order != -1) {
          pRVar30 = (cpi->common).ref_frame_map[lVar28];
          if (pRVar30 == (RefCntBuffer *)0x0) {
            ref_frame_map_pairs[lVar28].disp_order = -1;
            uVar13 = 0xffffffff;
          }
          else {
            lVar29 = lVar28;
            if (1 < pRVar30->ref_count) {
              for (; lVar29 != 7; lVar29 = lVar29 + 1) {
                if ((cpi->common).ref_frame_map[lVar29 + 1] == pRVar30) {
                  ref_frame_map_pairs[lVar29 + 1].pyr_level = -1;
                  ref_frame_map_pairs[lVar29 + 1].disp_order = -1;
                }
              }
            }
            ref_frame_map_pairs[lVar28].disp_order = pRVar30->display_order_hint;
            uVar13 = pRVar30->pyramid_level;
          }
          ref_frame_map_pairs[lVar28].pyr_level = uVar13;
        }
      }
    }
    uVar13 = (uint)(pAVar26->gf_group).arf_src_offset[bVar27] +
             (cpi->common).current_frame.frame_number;
    if ((pAVar26->gf_group).frame_parallel_level[bVar27] == 0) {
      if ((cpi->ext_flags).refresh_frame.update_pending == false) {
        av1_get_ref_frames(ref_frame_map_pairs,uVar13,cpi,(uint)bVar27,1,
                           (cpi->common).remapped_ref_idx);
      }
      else if (((pAVar17->rtc_ref).set_ref_frame_config != 0) ||
              (iVar14 = use_rtc_reference_structure_one_layer(cpi), iVar14 != 0)) {
        for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
          (cpi->common).remapped_ref_idx[lVar28] = (pAVar17->rtc_ref).ref_idx[lVar28];
        }
      }
    }
    bVar40 = false;
    for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
      if (((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar28] - 1U) < 8) &&
         (lVar29 = (long)(cpi->common).remapped_ref_idx
                         [(byte)"\x01\a\x05\x04\x06\x02\x03"[lVar28] - 1], lVar29 != -1)) {
        pRVar30 = (cpi->common).ref_frame_map[lVar29];
      }
      else {
        pRVar30 = (RefCntBuffer *)0x0;
      }
      pYVar34 = &pRVar30->buf;
      if (pRVar30 == (RefCntBuffer *)0x0) {
        pYVar34 = (YV12_BUFFER_CONFIG *)0x0;
      }
      ref_frame_buf[lVar28] = pYVar34;
      bVar40 = (bool)(bVar40 | pRVar30 != (RefCntBuffer *)0x0);
    }
    if ((!bVar40) && ((local_148.frame_type & 0xfd) == 1)) {
      return 1;
    }
    iVar14 = is_one_pass_rt_params(cpi);
    local_148.ref_frame_flags = (cpi->ext_flags).ref_frame_flags;
    for (lVar28 = 1; lVar28 != 7; lVar28 = lVar28 + 1) {
      uVar35 = (uint)lVar28;
      if (lVar28 == 3 && iVar14 != 0) {
        uVar35 = (cpi->sf).rt_sf.use_nonrd_altref_frame + 1;
      }
      if ((int)uVar35 < 1) {
        uVar35 = 0;
      }
      for (uVar22 = 0; uVar35 != uVar22; uVar22 = uVar22 + 1) {
        if ((ref_frame_buf[lVar28] == ref_frame_buf[uVar22]) &&
           (((uint)local_148.ref_frame_flags >>
             ((byte)("\x01\a\x05\x04\x06\x02\x03"[uVar22] - 1) & 0x1f) & 1) != 0)) {
          local_148.ref_frame_flags =
               local_148.ref_frame_flags &
               ~(1 << ((byte)("\x01\a\x05\x04\x06\x02\x03"[lVar28] - 1) & 0x1f));
          break;
        }
      }
    }
    pAVar17 = cpi->ppi;
    bVar27 = cpi->gf_frame_index;
    uVar22 = (ulong)bVar27;
    iVar14 = 7;
    if (((((pAVar17->gf_group).is_frame_non_ref[uVar22] == false) &&
         ((local_148._0_8_ & 0xfd00000000) != 0)) && (local_148.error_resilient_mode == 0)) &&
       ((cpi->ext_flags).use_primary_ref_none == false)) {
      if (cpi->use_ducky_encode == 0) {
        iVar14 = 0;
        if ((cpi->common).tiles.large_scale == 0) {
          if ((pAVar17->use_svc == 0) && ((pAVar17->rtc_ref).set_ref_frame_config == 0)) {
            uVar25 = (ulong)(uint)(pAVar17->gf_group).layer_depth[uVar22];
            if (uVar25 < 8) {
              lVar28 = *(long *)(&DAT_004bece8 + uVar25 * 8);
            }
            else {
              lVar28 = 7;
            }
            iVar14 = 7;
            iVar15 = 1;
            for (lVar29 = 0; pAVar26 = local_f0, lVar29 != 7; lVar29 = lVar29 + 1) {
              if ((cpi->common).remapped_ref_idx[lVar29] == pAVar17->fb_of_context_type[lVar28]) {
                iVar14 = iVar15 + -1;
              }
              iVar15 = iVar15 + 1;
            }
          }
          else {
            iVar14 = av1_svc_primary_ref_frame(cpi);
            bVar27 = cpi->gf_frame_index;
            uVar22 = (ulong)bVar27;
          }
        }
      }
      else {
        for (lVar28 = 0; lVar28 != 7; lVar28 = lVar28 + 1) {
          if ((cpi->common).remapped_ref_idx[lVar28] == (pAVar17->gf_group).primary_ref_idx[uVar22])
          {
            iVar14 = (int)lVar28;
            break;
          }
        }
      }
    }
    local_148.order_offset._0_1_ = (pAVar26->gf_group).arf_src_offset[uVar22];
    local_148.primary_ref_frame = iVar14;
    local_148.order_offset._1_3_ = 0;
    if (cpi->refresh_idx_available == false) {
      iVar14 = av1_get_refresh_frame_flags
                         (cpi,&local_148,FVar3,(uint)bVar27,uVar13,ref_frame_map_pairs);
    }
    else {
      iVar14 = 1 << ((byte)cpi->ref_refresh_index & 0x1f);
    }
    iVar15 = local_148.show_frame;
    iVar16 = 0;
    if ((pAVar26->gf_group).is_frame_non_ref[uVar22] == false) {
      iVar16 = iVar14;
    }
    local_148.refresh_frame_flags = iVar16;
    local_148.show_frame = iVar15;
    local_148.existing_fb_idx_to_show = 0xffffffff;
    if (local_148.show_existing_frame != 0) {
      for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
        pRVar30 = (cpi->common).ref_frame_map[lVar28];
        if ((pRVar30 != (RefCntBuffer *)0x0) && (pRVar30->display_order_hint == uVar13)) {
          local_148.existing_fb_idx_to_show = (int)lVar28;
        }
      }
    }
  }
  uVar7 = *(undefined8 *)(cpi->common).remapped_ref_idx;
  uVar8 = *(undefined8 *)((cpi->common).remapped_ref_idx + 2);
  uVar9 = *(undefined8 *)((cpi->common).remapped_ref_idx + 4);
  uVar10 = *(undefined8 *)((cpi->common).remapped_ref_idx + 6);
  local_148.remapped_ref_idx[4] = (int)uVar9;
  local_148.remapped_ref_idx[5] = (int)((ulong)uVar9 >> 0x20);
  local_148.remapped_ref_idx[6] = (int)uVar10;
  local_148.remapped_ref_idx[7] = (int)((ulong)uVar10 >> 0x20);
  local_148.remapped_ref_idx[0] = (int)uVar7;
  local_148.remapped_ref_idx[1] = (int)((ulong)uVar7 >> 0x20);
  local_148.remapped_ref_idx[2] = (int)uVar8;
  local_148.remapped_ref_idx[3] = (int)((ulong)uVar8 >> 0x20);
  (cpi->td).mb.delta_qindex = 0;
  (cpi->td).mb.rdmult_delta_qindex = 0;
  if (local_148.show_existing_frame == 0) {
    (cpi->common).quant_params.using_qmatrix = (cpi->oxcf).q_cfg.using_qm;
  }
  aVar31 = (cpi->oxcf).pass;
  local_f8 = frame_flags;
  if (aVar31 == AOM_RC_FIRST_PASS) {
    pAVar26 = cpi->ppi;
LAB_0034c37f:
    bVar27 = (pAVar26->gf_group).update_type[cpi->gf_frame_index];
    iVar14 = av1_gop_is_second_arf(&pAVar26->gf_group,(uint)cpi->gf_frame_index);
    iVar15 = av1_is_temporal_filter_on(&cpi->oxcf);
    bVar40 = true;
    if ((iVar15 != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) {
      bVar40 = cpi->compressor_stage == '\x01';
    }
    if ((((iVar14 == 0) && (bVar27 != 3)) && (bVar27 != 0)) || (bVar40)) {
LAB_0034c465:
      bVar40 = true;
      pYVar34 = frame_input.source;
    }
    else {
      if (local_148.frame_type == '\0') {
        if ((((cpi->oxcf).kf_cfg.enable_keyframe_filtering != 0) &&
            (local_148.show_existing_frame == 0)) &&
           (((cpi->oxcf).rc_cfg.best_allowed_q != 0 || ((cpi->oxcf).rc_cfg.worst_allowed_q != 0))))
        {
          ref_frame_map_pairs[0].pyr_level = 0;
          ref_frame_map_pairs[0].disp_order = 0;
          av1_estimate_noise_level
                    (frame_input.source,(double *)ref_frame_map_pairs,0,0,
                     ((cpi->common).seq_params)->bit_depth,0x32);
          if (0.0 < (double)ref_frame_map_pairs[0]) {
            av1_setup_past_independence(local_d0);
            goto LAB_0034c484;
          }
        }
        goto LAB_0034c465;
      }
      if ((iVar14 == 0) || ((cpi->sf).hl_sf.second_alt_ref_filtering != 0)) {
LAB_0034c484:
        pYVar34 = frame_input.source;
        ref_frame_buf[0]._0_4_ = 0;
        local_6c = 0;
        iVar15 = av1_rc_pick_q_and_bounds
                           (cpi,(cpi->oxcf).frm_dim_cfg.width,(cpi->oxcf).frm_dim_cfg.height,
                            (uint)cpi->gf_frame_index,&local_6c,(int *)ref_frame_buf);
        (cpi->common).current_frame.frame_type = local_148.frame_type;
        if ((bVar27 == 3) || (bVar27 == 0)) {
          pYVar24 = av1_tf_info_get_filtered_buf
                              (&cpi->ppi->tf_info,(uint)cpi->gf_frame_index,
                               (FRAME_DIFF *)ref_frame_map_pairs);
          if (pYVar24 == (YV12_BUFFER_CONFIG *)0x0) {
            iVar16 = 0;
          }
          else {
            frame_input.source = pYVar24;
            iVar16 = av1_check_show_filtered_frame
                               (pYVar24,(FRAME_DIFF *)ref_frame_map_pairs,iVar15,
                                ((cpi->common).seq_params)->bit_depth);
            if (iVar16 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = (cpi->common).showable_frame | 1;
            }
            (cpi->common).showable_frame = uVar13;
          }
          if ((pAVar26->gf_group).frame_type[cpi->gf_frame_index] != '\0') {
            cpi->ppi->show_existing_alt_ref = iVar16;
          }
        }
        if (iVar14 != 0) {
          pSVar6 = (cpi->common).seq_params;
          iVar14 = aom_realloc_frame_buffer
                             (&(cpi->ppi->tf_info).tf_buf_second_arf,(cpi->oxcf).frm_dim_cfg.width,
                              (cpi->oxcf).frm_dim_cfg.height,pSVar6->subsampling_x,
                              pSVar6->subsampling_y,(uint)pSVar6->use_highbitdepth,
                              (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                              (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,
                              (void *)0x0,cpi->alloc_pyramid,0);
          if (iVar14 != 0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate tf_buf_second_arf");
          }
          pYVar24 = &(cpi->ppi->tf_info).tf_buf_second_arf;
          av1_temporal_filter(cpi,(uint)(pAVar26->gf_group).arf_src_offset[cpi->gf_frame_index],
                              (uint)cpi->gf_frame_index,(FRAME_DIFF *)ref_frame_map_pairs,pYVar24);
          iVar14 = av1_check_show_filtered_frame
                             (pYVar24,(FRAME_DIFF *)ref_frame_map_pairs,iVar15,
                              ((cpi->common).seq_params)->bit_depth);
          if (iVar14 != 0) {
            aom_extend_frame_borders_c
                      (pYVar24,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
            frame_input.source = pYVar24;
          }
          piVar1 = &(cpi->common).showable_frame;
          *(byte *)piVar1 = (byte)*piVar1 | 1;
        }
        arr = pYVar34->metadata;
        if ((arr != (aom_metadata_array_t *)0x0) &&
           (iVar14 = aom_copy_metadata_to_frame_buffer(frame_input.source,arr), iVar14 != 0)) {
          aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                             "Failed to copy source metadata to the temporal filtered frame");
        }
        bVar40 = false;
      }
      else {
        bVar40 = true;
        pYVar34 = frame_input.source;
      }
    }
    FVar11 = local_148.frame_type;
    (cpi->common).show_frame = local_148.show_frame;
    (cpi->common).current_frame.frame_type = local_148.frame_type;
    av1_set_frame_size(cpi,(cpi->common).width,(cpi->common).height);
    if ((FVar11 == '\0') || ((bVar27 & 0xfe) == 2)) {
      av1_set_mv_search_params(cpi);
    }
    if (((cpi->gf_frame_index == '\0') && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
       (cpi->compressor_stage != '\x01')) {
      cVar41 = '\0';
      if (1 < (cpi->oxcf).gf_cfg.lag_in_frames) {
        cVar41 = (cpi->oxcf).algo_cfg.enable_tpl_model;
      }
      if (0x69 < (pAVar26->gf_group).size) {
        cVar41 = '\0';
      }
      if (local_148.frame_type == '\0') {
LAB_0034c72e:
        if (cVar41 != '\0') {
LAB_0034c732:
          if (*local_e8 == 0) {
            av1_tpl_preload_rc_estimate(cpi,&local_148);
            av1_tpl_setup_stats(cpi,0,&local_148);
          }
          goto LAB_0034c76b;
        }
      }
      else if (cVar41 != '\0') {
        if ((bVar27 & 0xfe) == 2) goto LAB_0034c732;
        if (cpi->use_ducky_encode != 0) {
          cVar41 = (cpi->ducky_encode_info).frame_info.gop_mode == '\x01';
          goto LAB_0034c72e;
        }
      }
      av1_init_tpl_stats(&cpi->ppi->tpl_data);
    }
LAB_0034c76b:
    iVar14 = av1_encode(cpi,local_c8,local_c0,&frame_input,&local_148,&frame_size);
    if (bVar40 || iVar14 != 0) goto LAB_0034c79f;
    iVar14 = is_psnr_calc_enabled(cpi);
    psVar39 = local_e0;
    if (iVar14 != 0) {
      pYVar24 = av1_realloc_and_scale_if_required
                          (local_d0,pYVar34,&cpi->scaled_source,(cpi->common).features.interp_filter
                           ,0,false,true,(cpi->oxcf).border_in_pixels,cpi->alloc_pyramid);
      cpi->source = pYVar24;
      cpi->unscaled_source = pYVar34;
    }
  }
  else {
    if ((cpi->compressor_stage != '\x01') && ((local_148._0_8_ & 0xfd00000000) == 0)) {
      av1_set_screen_content_options(cpi,&(cpi->common).features);
      aVar31 = (cpi->oxcf).pass;
    }
    pAVar26 = cpi->ppi;
    if ((((aVar31 != AOM_RC_ONE_PASS) || (pAVar26->lap_enabled != 0)) ||
        ((cpi->oxcf).mode != '\x01')) || ((cpi->oxcf).gf_cfg.lag_in_frames != 0)) goto LAB_0034c37f;
    iVar14 = av1_encode(cpi,local_c8,local_c0,&frame_input,&local_148,&frame_size);
LAB_0034c79f:
    psVar39 = local_e0;
    if (iVar14 != 0) {
      return 1;
    }
  }
  iVar14 = is_psnr_calc_enabled(cpi);
  if ((iVar14 != 0) && ((cpi->sf).rt_sf.use_rtc_tf != 0)) {
    cpi->source = &cpi->orig_source;
  }
  if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01'))
  goto LAB_0034c8d6;
  bVar27 = (cpi->common).current_frame.frame_type;
  if (((cpi->common).show_existing_frame == 0) ||
     (((cpi->common).features.error_resilient_mode & bVar27 != 0) != 0)) {
    uVar13 = (*local_f8 & 0xfffffff1) + (uint)(cpi->refresh_frame).golden_frame * 2 +
             (uint)(cpi->refresh_frame).alt_ref_frame * 8 +
             (uint)(cpi->refresh_frame).bwd_ref_frame * 4;
    if (bVar27 != 0) {
      uVar13 = uVar13 & 0xfffffffe;
      goto LAB_0034c8ae;
    }
    uVar13 = uVar13 | 1;
LAB_0034c8c1:
    uVar35 = 0x10;
LAB_0034c8c3:
    uVar13 = uVar13 | uVar35;
    *local_f8 = uVar13;
  }
  else {
    uVar13 = *local_f8 & 0xfffffff0;
LAB_0034c8ae:
    *local_f8 = uVar13;
    if ((bVar27 & 0xfd) == 0) goto LAB_0034c8c1;
    if (bVar27 == 3) {
      uVar35 = 0x20;
      goto LAB_0034c8c3;
    }
  }
  if ((cpi->common).features.error_resilient_mode == true) {
    *local_f8 = uVar13 | 0x40;
  }
LAB_0034c8d6:
  *psVar39 = frame_size;
  if (frame_size != 0) {
    pAVar26 = cpi->ppi;
    iVar14 = is_frame_droppable(&pAVar26->rtc_ref,&(cpi->ext_flags).refresh_frame);
    cpi->droppable = iVar14;
    if (((((pAVar26->use_svc != 0) || (0 < (cpi->oxcf).rc_cfg.drop_frames_water_mark)) &&
         ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)) &&
        (((cpi->svc).temporal_layer_id == 0 &&
         (pYVar34 = cpi->unscaled_source,
         (pYVar34->field_0).field_0.y_width == (cpi->svc).source_last_TL0.field_0.field_0.y_width)))
        ) && ((pYVar34->field_1).field_0.y_height ==
              (cpi->svc).source_last_TL0.field_1.field_0.y_height)) {
      pYVar24 = &(cpi->svc).source_last_TL0;
      aom_yv12_copy_y_c(pYVar34,pYVar24,1);
      aom_yv12_copy_u_c(cpi->unscaled_source,pYVar24,1);
      aom_yv12_copy_v_c(cpi->unscaled_source,pYVar24,1);
    }
  }
  return 0;
}

Assistant:

int av1_encode_strategy(AV1_COMP *const cpi, size_t *const size,
                        uint8_t *const dest, size_t dest_size,
                        unsigned int *frame_flags, int64_t *const time_stamp,
                        int64_t *const time_end,
                        const aom_rational64_t *const timestamp_ratio,
                        int *const pop_lookahead, int flush) {
  AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  ExternalFlags *const ext_flags = &cpi->ext_flags;
  GFConfig *const gf_cfg = &oxcf->gf_cfg;

  EncodeFrameInput frame_input;
  EncodeFrameParams frame_params;
  size_t frame_size;
  memset(&frame_input, 0, sizeof(frame_input));
  memset(&frame_params, 0, sizeof(frame_params));
  frame_size = 0;

#if CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS
  VBR_RATECTRL_INFO *vbr_rc_info = &cpi->vbr_rc_info;
  if (oxcf->pass == AOM_RC_THIRD_PASS && vbr_rc_info->ready == 0) {
    THIRD_PASS_FRAME_INFO frame_info[MAX_THIRD_PASS_BUF];
    av1_open_second_pass_log(cpi, 1);
    FILE *second_pass_log_stream = cpi->second_pass_log_stream;
    fseek(second_pass_log_stream, 0, SEEK_END);
    size_t file_size = ftell(second_pass_log_stream);
    rewind(second_pass_log_stream);
    size_t read_size = 0;
    while (read_size < file_size) {
      THIRD_PASS_GOP_INFO gop_info;
      struct aom_internal_error_info *error = cpi->common.error;
      // Read in GOP information from the second pass file.
      av1_read_second_pass_gop_info(second_pass_log_stream, &gop_info, error);
      TPL_INFO *tpl_info;
      AOM_CHECK_MEM_ERROR(cm->error, tpl_info, aom_malloc(sizeof(*tpl_info)));
      av1_read_tpl_info(tpl_info, second_pass_log_stream, error);
      // Read in per-frame info from second-pass encoding
      av1_read_second_pass_per_frame_info(second_pass_log_stream, frame_info,
                                          gop_info.num_frames, error);
      av1_vbr_rc_append_tpl_info(vbr_rc_info, tpl_info);
      read_size = ftell(second_pass_log_stream);
      aom_free(tpl_info);
    }
    av1_close_second_pass_log(cpi);
    if (cpi->oxcf.rc_cfg.mode == AOM_Q) {
      vbr_rc_info->base_q_index = cpi->oxcf.rc_cfg.cq_level;
      av1_vbr_rc_compute_q_indices(
          vbr_rc_info->base_q_index, vbr_rc_info->total_frame_count,
          vbr_rc_info->qstep_ratio_list, cm->seq_params->bit_depth,
          vbr_rc_info->q_index_list);
    } else {
      vbr_rc_info->base_q_index = av1_vbr_rc_info_estimate_base_q(
          vbr_rc_info->total_bit_budget, cm->seq_params->bit_depth,
          vbr_rc_info->scale_factors, vbr_rc_info->total_frame_count,
          vbr_rc_info->update_type_list, vbr_rc_info->qstep_ratio_list,
          vbr_rc_info->txfm_stats_list, vbr_rc_info->q_index_list, NULL);
    }
    vbr_rc_info->ready = 1;
#if CONFIG_RATECTRL_LOG
    rc_log_record_chunk_info(&cpi->rc_log, vbr_rc_info->base_q_index,
                             vbr_rc_info->total_frame_count);
#endif  // CONFIG_RATECTRL_LOG
  }
#endif  // CONFIG_BITRATE_ACCURACY && CONFIG_THREE_PASS

  // Check if we need to stuff more src frames
  if (flush == 0) {
    int srcbuf_size =
        av1_lookahead_depth(cpi->ppi->lookahead, cpi->compressor_stage);
    int pop_size =
        av1_lookahead_pop_sz(cpi->ppi->lookahead, cpi->compressor_stage);

    // Continue buffering look ahead buffer.
    if (srcbuf_size < pop_size) return -1;
  }

  if (!av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage)) {
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // TODO(sarahparker) finish bit allocation for one pass pyramid
  if (has_no_stats_stage(cpi)) {
    gf_cfg->gf_max_pyr_height =
        AOMMIN(gf_cfg->gf_max_pyr_height, USE_ALTREF_FOR_ONE_PASS);
    gf_cfg->gf_min_pyr_height =
        AOMMIN(gf_cfg->gf_min_pyr_height, gf_cfg->gf_max_pyr_height);
  }

  // Allocation of mi buffers.
  alloc_mb_mode_info_buffers(cpi);

  cpi->skip_tpl_setup_stats = 0;
#if !CONFIG_REALTIME_ONLY
  if (oxcf->pass != AOM_RC_FIRST_PASS) {
    TplParams *const tpl_data = &cpi->ppi->tpl_data;
    if (tpl_data->tpl_stats_pool[0] == NULL) {
      av1_setup_tpl_buffers(cpi->ppi, &cm->mi_params, oxcf->frm_dim_cfg.width,
                            oxcf->frm_dim_cfg.height, 0,
                            oxcf->gf_cfg.lag_in_frames);
    }
  }
  cpi->twopass_frame.this_frame = NULL;
  const int use_one_pass_rt_params = is_one_pass_rt_params(cpi);
  if (!use_one_pass_rt_params && !is_stat_generation_stage(cpi)) {
#if CONFIG_COLLECT_COMPONENT_TIMING
    start_timing(cpi, av1_get_second_pass_params_time);
#endif

    // Initialise frame_level_rate_correction_factors with value previous
    // to the parallel frames.
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      for (int i = 0; i < RATE_FACTOR_LEVELS; i++) {
        cpi->rc.frame_level_rate_correction_factors[i] =
#if CONFIG_FPMT_TEST
            (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE)
                ? cpi->ppi->p_rc.temp_rate_correction_factors[i]
                :
#endif  // CONFIG_FPMT_TEST
                cpi->ppi->p_rc.rate_correction_factors[i];
      }
    }

    // copy mv_stats from ppi to frame_level cpi.
    cpi->mv_stats = cpi->ppi->mv_stats;
    av1_get_second_pass_params(cpi, &frame_params, *frame_flags);
#if CONFIG_COLLECT_COMPONENT_TIMING
    end_timing(cpi, av1_get_second_pass_params_time);
#endif
  }
#endif

  if (!is_stat_generation_stage(cpi)) {
    // TODO(jingning): fwd key frame always uses show existing frame?
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE &&
        gf_group->refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
      frame_params.show_existing_frame = 1;
    } else {
      frame_params.show_existing_frame =
          (cpi->ppi->show_existing_alt_ref &&
           gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) ||
          gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE;
    }
    frame_params.show_existing_frame &= allow_show_existing(cpi, *frame_flags);

    // Special handling to reset 'show_existing_frame' in case of dropped
    // frames.
    if (oxcf->rc_cfg.drop_frames_water_mark &&
        (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE ||
         gf_group->update_type[cpi->gf_frame_index] == INTNL_OVERLAY_UPDATE)) {
      // During the encode of an OVERLAY_UPDATE/INTNL_OVERLAY_UPDATE frame, loop
      // over the gf group to check if the corresponding
      // ARF_UPDATE/INTNL_ARF_UPDATE frame was dropped.
      int cur_disp_idx = gf_group->display_idx[cpi->gf_frame_index];
      for (int idx = 0; idx < cpi->gf_frame_index; idx++) {
        if (cur_disp_idx == gf_group->display_idx[idx]) {
          assert(IMPLIES(
              gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE,
              gf_group->update_type[idx] == ARF_UPDATE));
          assert(IMPLIES(gf_group->update_type[cpi->gf_frame_index] ==
                             INTNL_OVERLAY_UPDATE,
                         gf_group->update_type[idx] == INTNL_ARF_UPDATE));
          // Reset show_existing_frame and set cpi->is_dropped_frame to true if
          // the frame was dropped during its first encode.
          if (gf_group->is_frame_dropped[idx]) {
            frame_params.show_existing_frame = 0;
            assert(!cpi->is_dropped_frame);
            cpi->is_dropped_frame = true;
          }
          break;
        }
      }
    }

    // Reset show_existing_alt_ref decision to 0 after it is used.
    if (gf_group->update_type[cpi->gf_frame_index] == OVERLAY_UPDATE) {
      cpi->ppi->show_existing_alt_ref = 0;
    }
  } else {
    frame_params.show_existing_frame = 0;
  }

  struct lookahead_entry *source = NULL;
  struct lookahead_entry *last_source = NULL;
  if (frame_params.show_existing_frame) {
    source = av1_lookahead_peek(cpi->ppi->lookahead, 0, cpi->compressor_stage);
    *pop_lookahead = 1;
    frame_params.show_frame = 1;
  } else {
    source = choose_frame_source(cpi, &flush, pop_lookahead, &last_source,
                                 &frame_params.show_frame);
  }

  if (source == NULL) {  // If no source was found, we can't encode a frame.
#if !CONFIG_REALTIME_ONLY
    if (flush && oxcf->pass == AOM_RC_FIRST_PASS &&
        !cpi->ppi->twopass.first_pass_done) {
      av1_end_first_pass(cpi); /* get last stats packet */
      cpi->ppi->twopass.first_pass_done = 1;
    }
#endif
    return -1;
  }

  // reset src_offset to allow actual encode call for this frame to get its
  // source.
  gf_group->src_offset[cpi->gf_frame_index] = 0;

  // Source may be changed if temporal filtered later.
  frame_input.source = &source->img;
  if ((cpi->ppi->use_svc || cpi->rc.prev_frame_is_dropped) &&
      last_source != NULL)
    av1_svc_set_last_source(cpi, &frame_input, &last_source->img);
  else
    frame_input.last_source = last_source != NULL ? &last_source->img : NULL;
  frame_input.ts_duration = source->ts_end - source->ts_start;
  // Save unfiltered source. It is used in av1_get_second_pass_params().
  cpi->unfiltered_source = frame_input.source;

  *time_stamp = source->ts_start;
  *time_end = source->ts_end;
  if (source->ts_start < cpi->time_stamps.first_ts_start) {
    cpi->time_stamps.first_ts_start = source->ts_start;
    cpi->time_stamps.prev_ts_end = source->ts_start;
  }

  av1_apply_encoding_flags(cpi, source->flags);
  *frame_flags = (source->flags & AOM_EFLAG_FORCE_KF) ? FRAMEFLAGS_KEY : 0;

#if CONFIG_FPMT_TEST
  if (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) {
      cpi->framerate = cpi->temp_framerate;
    }
  }
#endif  // CONFIG_FPMT_TEST

  // Shown frames and arf-overlay frames need frame-rate considering
  if (frame_params.show_frame)
    adjust_frame_rate(cpi, source->ts_start, source->ts_end);

  if (!frame_params.show_existing_frame) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->film_grain_table) {
      cm->cur_frame->film_grain_params_present = aom_film_grain_table_lookup(
          cpi->film_grain_table, *time_stamp, *time_end, 0 /* =erase */,
          &cm->film_grain_params);
    } else {
      cm->cur_frame->film_grain_params_present =
          cm->seq_params->film_grain_params_present;
    }
#endif
    // only one operating point supported now
    const int64_t pts64 = ticks_to_timebase_units(timestamp_ratio, *time_stamp);
    if (pts64 < 0 || pts64 > UINT32_MAX) return AOM_CODEC_ERROR;

    cm->frame_presentation_time = (uint32_t)pts64;
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_get_one_pass_rt_params_time);
#endif
#if CONFIG_REALTIME_ONLY
  av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                             *frame_flags);
  if (use_rtc_reference_structure_one_layer(cpi))
    av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
#else
  if (use_one_pass_rt_params) {
    av1_get_one_pass_rt_params(cpi, &frame_params.frame_type, &frame_input,
                               *frame_flags);
    if (use_rtc_reference_structure_one_layer(cpi))
      av1_set_rtc_reference_structure_one_layer(cpi, cpi->gf_frame_index == 0);
  }
#endif
#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_get_one_pass_rt_params_time);
#endif

  FRAME_UPDATE_TYPE frame_update_type =
      get_frame_update_type(gf_group, cpi->gf_frame_index);

  if (frame_params.show_existing_frame &&
      frame_params.frame_type != KEY_FRAME) {
    // Force show-existing frames to be INTER, except forward keyframes
    frame_params.frame_type = INTER_FRAME;
  }

  // Per-frame encode speed.  In theory this can vary, but things may have
  // been written assuming speed-level will not change within a sequence, so
  // this parameter should be used with caution.
  frame_params.speed = oxcf->speed;

#if !CONFIG_REALTIME_ONLY
  // Set forced key frames when necessary. For two-pass encoding / lap mode,
  // this is already handled by av1_get_second_pass_params. However when no
  // stats are available, we still need to check if the new frame is a keyframe.
  // For one pass rt, this is already checked in av1_get_one_pass_rt_params.
  if (!use_one_pass_rt_params &&
      (is_stat_generation_stage(cpi) || has_no_stats_stage(cpi))) {
    // Current frame is coded as a key-frame for any of the following cases:
    // 1) First frame of a video
    // 2) For all-intra frame encoding
    // 3) When a key-frame is forced
    const int kf_requested =
        (cm->current_frame.frame_number == 0 ||
         oxcf->kf_cfg.key_freq_max == 0 || (*frame_flags & FRAMEFLAGS_KEY));
    if (kf_requested && frame_update_type != OVERLAY_UPDATE &&
        frame_update_type != INTNL_OVERLAY_UPDATE) {
      frame_params.frame_type = KEY_FRAME;
    } else if (is_stat_generation_stage(cpi)) {
      // For stats generation, set the frame type to inter here.
      frame_params.frame_type = INTER_FRAME;
    }
  }
#endif

  // Work out some encoding parameters specific to the pass:
  if (has_no_stats_stage(cpi) && oxcf->q_cfg.aq_mode == CYCLIC_REFRESH_AQ) {
    av1_cyclic_refresh_update_parameters(cpi);
  } else if (is_stat_generation_stage(cpi)) {
    cpi->td.mb.e_mbd.lossless[0] = is_lossless_requested(&oxcf->rc_cfg);
  } else if (is_stat_consumption_stage(cpi)) {
#if CONFIG_MISMATCH_DEBUG
    mismatch_move_frame_idx_w();
#endif
#if TXCOEFF_COST_TIMER
    cm->txcoeff_cost_timer = 0;
    cm->txcoeff_cost_count = 0;
#endif
  }

  if (!is_stat_generation_stage(cpi))
    set_ext_overrides(cm, &frame_params, ext_flags);

  // Shown keyframes and S frames refresh all reference buffers
  const int force_refresh_all =
      ((frame_params.frame_type == KEY_FRAME && frame_params.show_frame) ||
       frame_params.frame_type == S_FRAME) &&
      !frame_params.show_existing_frame;

  av1_configure_buffer_updates(
      cpi, &frame_params.refresh_frame, frame_update_type,
      gf_group->refbuf_state[cpi->gf_frame_index], force_refresh_all);

  if (!is_stat_generation_stage(cpi)) {
    const YV12_BUFFER_CONFIG *ref_frame_buf[INTER_REFS_PER_FRAME];

    RefFrameMapPair ref_frame_map_pairs[REF_FRAMES];
    init_ref_map_pair(cpi, ref_frame_map_pairs);
    const int order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];
    const int cur_frame_disp =
        cpi->common.current_frame.frame_number + order_offset;

    int get_ref_frames = 0;
#if CONFIG_FPMT_TEST
    get_ref_frames =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
    if (get_ref_frames ||
        gf_group->frame_parallel_level[cpi->gf_frame_index] == 0) {
      if (!ext_flags->refresh_frame.update_pending) {
        av1_get_ref_frames(ref_frame_map_pairs, cur_frame_disp, cpi,
                           cpi->gf_frame_index, 1, cm->remapped_ref_idx);
      } else if (cpi->ppi->rtc_ref.set_ref_frame_config ||
                 use_rtc_reference_structure_one_layer(cpi)) {
        for (unsigned int i = 0; i < INTER_REFS_PER_FRAME; i++)
          cm->remapped_ref_idx[i] = cpi->ppi->rtc_ref.ref_idx[i];
      }
    }

    // Get the reference frames
    bool has_ref_frames = false;
    for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
      const RefCntBuffer *ref_frame =
          get_ref_frame_buf(cm, ref_frame_priority_order[i]);
      ref_frame_buf[i] = ref_frame != NULL ? &ref_frame->buf : NULL;
      if (ref_frame != NULL) has_ref_frames = true;
    }
    if (!has_ref_frames && (frame_params.frame_type == INTER_FRAME ||
                            frame_params.frame_type == S_FRAME)) {
      return AOM_CODEC_ERROR;
    }

    // Work out which reference frame slots may be used.
    frame_params.ref_frame_flags =
        get_ref_frame_flags(&cpi->sf, is_one_pass_rt_params(cpi), ref_frame_buf,
                            ext_flags->ref_frame_flags);

    // Set primary_ref_frame of non-reference frames as PRIMARY_REF_NONE.
    if (cpi->ppi->gf_group.is_frame_non_ref[cpi->gf_frame_index]) {
      frame_params.primary_ref_frame = PRIMARY_REF_NONE;
    } else {
      frame_params.primary_ref_frame =
          choose_primary_ref_frame(cpi, &frame_params);
    }

    frame_params.order_offset = gf_group->arf_src_offset[cpi->gf_frame_index];

    // Call av1_get_refresh_frame_flags() if refresh index not available.
    if (!cpi->refresh_idx_available) {
      frame_params.refresh_frame_flags = av1_get_refresh_frame_flags(
          cpi, &frame_params, frame_update_type, cpi->gf_frame_index,
          cur_frame_disp, ref_frame_map_pairs);
    } else {
      assert(cpi->ref_refresh_index != INVALID_IDX);
      frame_params.refresh_frame_flags = (1 << cpi->ref_refresh_index);
    }

    // Make the frames marked as is_frame_non_ref to non-reference frames.
    if (gf_group->is_frame_non_ref[cpi->gf_frame_index])
      frame_params.refresh_frame_flags = 0;

    frame_params.existing_fb_idx_to_show = INVALID_IDX;
    // Find the frame buffer to show based on display order.
    if (frame_params.show_existing_frame) {
      for (int frame = 0; frame < REF_FRAMES; frame++) {
        const RefCntBuffer *const buf = cm->ref_frame_map[frame];
        if (buf == NULL) continue;
        const int frame_order = (int)buf->display_order_hint;
        if (frame_order == cur_frame_disp)
          frame_params.existing_fb_idx_to_show = frame;
      }
    }
  }

  // The way frame_params->remapped_ref_idx is setup is a placeholder.
  // Currently, reference buffer assignment is done by update_ref_frame_map()
  // which is called by high-level strategy AFTER encoding a frame.  It
  // modifies cm->remapped_ref_idx.  If you want to use an alternative method
  // to determine reference buffer assignment, just put your assignments into
  // frame_params->remapped_ref_idx here and they will be used when encoding
  // this frame.  If frame_params->remapped_ref_idx is setup independently of
  // cm->remapped_ref_idx then update_ref_frame_map() will have no effect.
  memcpy(frame_params.remapped_ref_idx, cm->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  cpi->td.mb.rdmult_delta_qindex = cpi->td.mb.delta_qindex = 0;

  if (!frame_params.show_existing_frame) {
    cm->quant_params.using_qmatrix = oxcf->q_cfg.using_qm;
  }

  const int is_intra_frame = frame_params.frame_type == KEY_FRAME ||
                             frame_params.frame_type == INTRA_ONLY_FRAME;
  FeatureFlags *const features = &cm->features;
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->pass == AOM_RC_ONE_PASS || oxcf->pass >= AOM_RC_SECOND_PASS) &&
      is_intra_frame) {
    av1_set_screen_content_options(cpi, features);
  }

#if CONFIG_REALTIME_ONLY
  if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                 &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#else
  if (has_no_stats_stage(cpi) && oxcf->mode == REALTIME &&
      gf_cfg->lag_in_frames == 0) {
    if (av1_encode(cpi, dest, dest_size, &frame_input, &frame_params,
                   &frame_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else if (denoise_and_encode(cpi, dest, dest_size, &frame_input,
                                &frame_params, &frame_size) != AOM_CODEC_OK) {
    return AOM_CODEC_ERROR;
  }
#endif  // CONFIG_REALTIME_ONLY

  // This is used in rtc temporal filter case. Use true source in the PSNR
  // calculation.
  if (is_psnr_calc_enabled(cpi) && cpi->sf.rt_sf.use_rtc_tf) {
    assert(cpi->orig_source.buffer_alloc_sz > 0);
    cpi->source = &cpi->orig_source;
  }

  if (!is_stat_generation_stage(cpi)) {
    // First pass doesn't modify reference buffer assignment or produce frame
    // flags
    update_frame_flags(&cpi->common, &cpi->refresh_frame, frame_flags);
    set_additional_frame_flags(cm, frame_flags);
  }

#if !CONFIG_REALTIME_ONLY
#if TXCOEFF_COST_TIMER
  if (!is_stat_generation_stage(cpi)) {
    cm->cum_txcoeff_cost_timer += cm->txcoeff_cost_timer;
    fprintf(stderr,
            "\ntxb coeff cost block number: %ld, frame time: %ld, cum time %ld "
            "in us\n",
            cm->txcoeff_cost_count, cm->txcoeff_cost_timer,
            cm->cum_txcoeff_cost_timer);
  }
#endif
#endif  // !CONFIG_REALTIME_ONLY

#if CONFIG_TUNE_VMAF
  if (!is_stat_generation_stage(cpi) &&
      (oxcf->tune_cfg.tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
       oxcf->tune_cfg.tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN)) {
    av1_update_vmaf_curve(cpi);
  }
#endif

  *size = frame_size;

  // Leave a signal for a higher level caller about if this frame is droppable
  if (*size > 0) {
    cpi->droppable =
        is_frame_droppable(&cpi->ppi->rtc_ref, &ext_flags->refresh_frame);
  }

  // For SVC, or when frame-dropper is enabled:
  // keep track of the (unscaled) source corresponding to the refresh of LAST
  // reference (base temporal layer - TL0). Copy only for the
  // top spatial enhancement layer so all spatial layers of the next
  // superframe have last_source to be aligned with previous TL0 superframe.
  // Avoid cases where resolution changes for unscaled source (top spatial
  // layer). Only needs to be done for frame that are encoded (size > 0).
  if (*size > 0 &&
      (cpi->ppi->use_svc || cpi->oxcf.rc_cfg.drop_frames_water_mark > 0) &&
      cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1 &&
      cpi->svc.temporal_layer_id == 0 &&
      cpi->unscaled_source->y_width == cpi->svc.source_last_TL0.y_width &&
      cpi->unscaled_source->y_height == cpi->svc.source_last_TL0.y_height) {
    aom_yv12_copy_y(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_u(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
    aom_yv12_copy_v(cpi->unscaled_source, &cpi->svc.source_last_TL0, 1);
  }

  return AOM_CODEC_OK;
}